

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O2

void issue316(void)

{
  uint8_t *puVar1;
  _Bool _Var2;
  roaring_bitmap_t *r;
  roaring_bitmap_t *x1;
  roaring_bitmap_t *r1;
  
  r = roaring_bitmap_create();
  puVar1 = &(r->high_low_container).flags;
  *puVar1 = *puVar1 | 1;
  roaring_bitmap_add_range_closed(r,1,99);
  x1 = roaring_bitmap_create();
  roaring_bitmap_or_inplace(x1,r);
  _Var2 = roaring_bitmap_is_subset(x1,r);
  _assert_true((ulong)_Var2,"roaring_bitmap_is_subset(rb2, rb1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xec7);
  _Var2 = roaring_bitmap_is_subset(r,x1);
  _assert_true((ulong)_Var2,"roaring_bitmap_is_subset(rb1, rb2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xec8);
  _Var2 = roaring_bitmap_equals(r,x1);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(rb1, rb2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xec9);
  r1 = roaring_bitmap_copy(x1);
  _Var2 = roaring_bitmap_is_subset(r1,r);
  _assert_true((ulong)_Var2,"roaring_bitmap_is_subset(rb3, rb1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xecb);
  _Var2 = roaring_bitmap_is_subset(r,r1);
  _assert_true((ulong)_Var2,"roaring_bitmap_is_subset(rb1, rb3)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xecc);
  _Var2 = roaring_bitmap_equals(r,r1);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(rb1, rb3)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xecd);
  _Var2 = roaring_bitmap_equals(r,x1);
  _assert_true((ulong)_Var2,"roaring_bitmap_equals(rb1, rb2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xece);
  roaring_bitmap_free(r);
  roaring_bitmap_free(x1);
  roaring_bitmap_free(r1);
  return;
}

Assistant:

DEFINE_TEST(issue316) {
    roaring_bitmap_t *rb1 = roaring_bitmap_create();
    roaring_bitmap_set_copy_on_write(rb1, true);
    roaring_bitmap_add_range(rb1, 1, 100);
    roaring_bitmap_t *rb2 = roaring_bitmap_create();
    roaring_bitmap_or_inplace(rb2, rb1);
    assert_true(roaring_bitmap_is_subset(rb2, rb1));
    assert_true(roaring_bitmap_is_subset(rb1, rb2));
    assert_true(roaring_bitmap_equals(rb1, rb2));
    roaring_bitmap_t *rb3 = roaring_bitmap_copy(rb2);
    assert_true(roaring_bitmap_is_subset(rb3, rb1));
    assert_true(roaring_bitmap_is_subset(rb1, rb3));
    assert_true(roaring_bitmap_equals(rb1, rb3));
    assert_true(roaring_bitmap_equals(rb1, rb2));
    roaring_bitmap_free(rb1);
    roaring_bitmap_free(rb2);
    roaring_bitmap_free(rb3);
}